

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverCE.h
# Opt level: O2

void BGIP_SolverCE::OrderedInsertJPPVValuePair
               (JPPVValuePair *pv,list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_> *l)

{
  _List_node_base *p_Var1;
  const_iterator __position;
  double dVar2;
  double dVar3;
  JPPVValuePair *local_18;
  
  local_18 = pv;
  dVar2 = (double)(**(code **)(*(long *)pv + 0x18))();
  p_Var1 = (_List_node_base *)l;
  do {
    p_Var1 = (((_List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_> *)&p_Var1->_M_next)->
             _M_impl)._M_node.super__List_node_base._M_next;
    __position._M_node = (_List_node_base *)l;
    if (p_Var1 == (_List_node_base *)l) break;
    dVar3 = (double)(*(code *)(p_Var1[1]._M_next)->_M_next[1]._M_prev)();
    __position._M_node = p_Var1;
  } while (dVar2 < dVar3);
  std::__cxx11::list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>::insert
            (l,__position,&local_18);
  return;
}

Assistant:

static void OrderedInsertJPPVValuePair(JPPVValuePair* pv, 
                                           std::list<JPPVValuePair*>& l)
        {
            double v_pv = pv->GetValue();
            std::list<JPPVValuePair*>::iterator it = l.begin(); //=front - highest values
            std::list<JPPVValuePair*>::iterator last = l.end(); //=back - lowest values
            while(it != last)
            {
                JPPVValuePair* temp = *it;
                double val = temp->GetValue();
                if( v_pv < val )
                {
                    it++;
                }
                else
                {
                    l.insert(it, pv);
                    return;
                }
            }
            //this should only happen when size=0
            l.insert(last, pv);
        }